

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

void SUNMatDestroy_Sparse(SUNMatrix A)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if (*(long *)(*in_RDI + 0x20) != 0) {
        free(*(void **)(*in_RDI + 0x20));
        *(undefined8 *)(*in_RDI + 0x20) = 0;
      }
      if (*(long *)(*in_RDI + 0x30) != 0) {
        free(*(void **)(*in_RDI + 0x30));
        *(undefined8 *)(*in_RDI + 0x30) = 0;
        *(undefined8 *)(*in_RDI + 0x40) = 0;
        *(undefined8 *)(*in_RDI + 0x50) = 0;
      }
      if (*(long *)(*in_RDI + 0x38) != 0) {
        free(*(void **)(*in_RDI + 0x38));
        *(undefined8 *)(*in_RDI + 0x38) = 0;
        *(undefined8 *)(*in_RDI + 0x48) = 0;
        *(undefined8 *)(*in_RDI + 0x58) = 0;
      }
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void SUNMatDestroy_Sparse(SUNMatrix A)
{
  if (A == NULL) { return; }

  /* free content */
  if (A->content != NULL)
  {
    /* free data array */
    if (SM_DATA_S(A))
    {
      free(SM_DATA_S(A));
      SM_DATA_S(A) = NULL;
    }
    /* free index values array */
    if (SM_INDEXVALS_S(A))
    {
      free(SM_INDEXVALS_S(A));
      SM_INDEXVALS_S(A)        = NULL;
      SM_CONTENT_S(A)->rowvals = NULL;
      SM_CONTENT_S(A)->colvals = NULL;
    }
    /* free index pointers array */
    if (SM_INDEXPTRS_S(A))
    {
      free(SM_INDEXPTRS_S(A));
      SM_INDEXPTRS_S(A)        = NULL;
      SM_CONTENT_S(A)->colptrs = NULL;
      SM_CONTENT_S(A)->rowptrs = NULL;
    }
    /* free content struct */
    free(A->content);
    A->content = NULL;
  }

  /* free ops and matrix */
  if (A->ops)
  {
    free(A->ops);
    A->ops = NULL;
  }
  free(A);
  A = NULL;

  return;
}